

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Glucose::Heap<Glucose::SimpSolver::ElimLt>::clear
          (Heap<Glucose::SimpSolver::ElimLt> *this,bool dealloc)

{
  int *__ptr;
  int *piVar1;
  long lVar2;
  
  __ptr = (this->heap).data;
  if ((this->heap).sz < 1) {
    if (__ptr == (int *)0x0) {
      return;
    }
  }
  else {
    piVar1 = (this->indices).data;
    lVar2 = 0;
    do {
      piVar1[__ptr[lVar2]] = -1;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->heap).sz);
  }
  (this->heap).sz = 0;
  if (dealloc) {
    free(__ptr);
    (this->heap).data = (int *)0x0;
    (this->heap).cap = 0;
  }
  return;
}

Assistant:

void clear(bool dealloc = false) 
    { 
        for (int i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear(dealloc); 
    }